

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O3

void __thiscall de::SpinBarrier::removeThread(SpinBarrier *this,WaitMode requestedMode)

{
  deInt32 *pdVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  uVar3 = this->m_numThreads;
  if ((0 < this->m_numLeaving) && (this->m_numLeaving != 0)) {
    bVar4 = requestedMode == WAIT_MODE_YIELD;
    if (requestedMode == WAIT_MODE_AUTO) {
      bVar4 = this->m_numCores < uVar3;
    }
    do {
      if (bVar4) {
        deYield();
      }
    } while (this->m_numLeaving != 0);
  }
  LOCK();
  this->m_numRemoved = this->m_numRemoved + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &this->m_numEntered;
  iVar2 = *pdVar1;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  if (iVar2 + 1U == uVar3) {
    this->m_numThreads = this->m_numThreads - this->m_numRemoved;
    this->m_numLeaving = this->m_numThreads;
    this->m_numRemoved = 0;
    this->m_numEntered = 0;
  }
  return;
}

Assistant:

void SpinBarrier::removeThread (WaitMode requestedMode)
{
	const deInt32	cachedNumThreads	= m_numThreads;
	const WaitMode	waitMode			= getWaitMode(requestedMode, m_numCores, cachedNumThreads);

	// Wait for other threads exiting previous barrier
	if (m_numLeaving > 0)
	{
		for (;;)
		{
			if (m_numLeaving == 0)
				break;

			wait(waitMode);
		}
	}

	// Ask for last thread entering barrier to adjust thread count
	deAtomicIncrement32(&m_numRemoved);

	// See sync() - use cached value
	if (deAtomicIncrement32(&m_numEntered) == cachedNumThreads)
	{
		// Release all waiting threads.
		m_numThreads -= m_numRemoved;
		m_numLeaving  = m_numThreads;
		m_numRemoved  = 0;

		deMemoryReadWriteFence();
		m_numEntered  = 0;
	}
}